

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O3

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_entry
          (BinBinaryReader *this,Hash *entryKeyHash,Embed *entry)

{
  uint uVar1;
  uint *puVar2;
  BinCompat *pBVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  ssize_t sVar7;
  reference pvVar8;
  size_t in_RCX;
  uint *pos;
  void *__buf;
  ushort *pos_00;
  char *pcVar9;
  char *msg;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  Type type;
  Type local_49;
  BinaryReader *local_48;
  ulong local_40;
  char *local_38;
  
  puVar2 = (uint *)(this->reader).cur_;
  pos = puVar2 + 1;
  if ((this->reader).cap_ < pos) {
    pcVar9 = "reader.read(entryLength)";
    pos = puVar2;
  }
  else {
    local_48 = &this->reader;
    uVar1 = *puVar2;
    (this->reader).cur_ = (char *)pos;
    pcVar9 = (this->reader).beg_;
    sVar7 = BinaryReader::read(local_48,(int)entryKeyHash,puVar2,in_RCX);
    if ((char)sVar7 == '\0') {
      pcVar9 = "reader.read(entryKeyHash.value)";
    }
    else {
      puVar2 = (uint *)(this->reader).cur_;
      pos_00 = (ushort *)((long)puVar2 + 2);
      if (pos_00 <= (this->reader).cap_) {
        uVar10 = (ulong)(ushort)*puVar2;
        (this->reader).cur_ = (char *)pos_00;
        uVar11 = (ulong)uVar1;
        local_38 = pcVar9;
        if (uVar10 != 0) {
          local_40 = (ulong)uVar1;
          do {
            pvVar8 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<>
                               (&entry->items);
            local_49 = NONE;
            pcVar9 = (this->reader).cur_;
            sVar7 = BinaryReader::read(local_48,(int)pvVar8,__buf,in_RCX);
            if ((char)sVar7 == '\0') {
              msg = "reader.read(name)";
LAB_0010ffa8:
              bVar6 = fail_msg(this,msg,pcVar9);
              goto LAB_0010ffb3;
            }
            pcVar9 = (this->reader).cur_;
            if ((this->reader).cap_ < pcVar9 + 1) {
LAB_0010ff8f:
              msg = "reader.read(type)";
              goto LAB_0010ffa8;
            }
            cVar5 = *pcVar9;
            (this->reader).cur_ = pcVar9 + 1;
            pBVar3 = (this->reader).compat_;
            cVar5 = (**(code **)(*(long *)pBVar3 + 0x10))(pBVar3,cVar5,&local_49);
            if (cVar5 == '\0') goto LAB_0010ff8f;
            pcVar9 = (this->reader).cur_;
            bVar4 = read_value_of(this,&pvVar8->value,local_49);
            if (!bVar4) {
              msg = "read_value_of(item, type)";
              goto LAB_0010ffa8;
            }
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
          pos_00 = (ushort *)(this->reader).cur_;
          uVar11 = local_40;
        }
        bVar6 = (byte)in_RCX;
        lVar13 = (long)pos_00 - (long)local_48->beg_;
        lVar12 = (long)pos + (uVar11 - (long)local_38);
        if (lVar13 != lVar12) {
          bVar6 = fail_msg(this,"reader.position() == position + entryLength",(char *)pos_00);
        }
        bVar6 = lVar13 == lVar12 | bVar6;
LAB_0010ffb3:
        return (bool)(bVar6 & 1);
      }
      pcVar9 = "reader.read(count)";
      pos = puVar2;
    }
  }
  bVar4 = fail_msg(this,pcVar9,(char *)pos);
  return bVar4;
}

Assistant:

bool read_entry(Hash& entryKeyHash, Embed& entry) noexcept {
            uint32_t entryLength = 0;
            uint16_t count = 0;
            bin_assert(reader.read(entryLength));
            size_t position = reader.position();
            bin_assert(reader.read(entryKeyHash.value));
            bin_assert(reader.read(count));
            for (size_t i = 0; i != count; i++) {
                auto& [name, item] = entry.items.emplace_back();
                Type type = {};
                bin_assert(reader.read(name));
                bin_assert(reader.read(type));
                bin_assert(read_value_of(item, type));
            }
            bin_assert(reader.position() == position + entryLength);
            return true;
        }